

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

bool flatbuffers::IsVectorOfStruct(Type *type)

{
  if (((type->base_type == BASE_TYPE_VECTOR64) || (type->base_type == BASE_TYPE_VECTOR)) &&
     (type->element == BASE_TYPE_STRUCT)) {
    return type->struct_def->fixed;
  }
  return false;
}

Assistant:

inline bool IsVectorOfStruct(const Type &type) {
  return IsVector(type) && IsStruct(type.VectorType());
}